

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O0

int __thiscall ncnn::Yolov3Detection::load_param(Yolov3Detection *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  Mat *in_RDI;
  float fVar2;
  int id;
  int def;
  Mat *this_00;
  int in_stack_ffffffffffffff64;
  ParamDict *in_stack_ffffffffffffff68;
  Mat local_90 [2];
  ParamDict *local_10;
  
  def = 0;
  local_10 = in_RSI;
  iVar1 = ParamDict::get(in_RSI,0,0x14);
  *(int *)&in_RDI[2].cstep = iVar1;
  id = 5;
  iVar1 = ParamDict::get(local_10,1,5);
  *(int *)((long)&in_RDI[2].cstep + 4) = iVar1;
  iVar1 = ParamDict::get(local_10,2,1);
  *(int *)&in_RDI[3].refcount = iVar1;
  fVar2 = ParamDict::get(local_10,3,0.25);
  *(float *)((long)&in_RDI[3].refcount + 4) = fVar2;
  fVar2 = ParamDict::get(local_10,4,0.45);
  *(float *)&in_RDI[3].elemsize = fVar2;
  iVar1 = ParamDict::get(local_10,id,def);
  *(int *)&in_RDI[3].data = iVar1;
  iVar1 = ParamDict::get(local_10,6,def);
  *(int *)((long)&in_RDI[3].data + 4) = iVar1;
  this_00 = local_90;
  Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,this_00);
  Mat::operator=(in_RDI,(Mat *)CONCAT44(def,id));
  Mat::~Mat((Mat *)0x1b7444);
  Mat::~Mat((Mat *)0x1b744e);
  return 0;
}

Assistant:

int Yolov3Detection::load_param(const ParamDict &pd)
{
    classes = pd.get(0, 20);
    box_num = pd.get(1, 5);
    softmax_enable = pd.get(2, 1);
    confidence_threshold = pd.get(3, 0.25f);
    nms_threshold = pd.get(4, 0.45f);
    net_width = pd.get(5, 0);
    net_height = pd.get(6, 0);
    biases = pd.get(7, Mat());
    return 0;
}